

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_25::BinaryReader::ReadTargetFeaturesSections
          (BinaryReader *this,Offset section_size)

{
  int iVar1;
  Result RVar2;
  char *format;
  bool bVar3;
  uint8_t prefix;
  string_view name;
  byte local_4d;
  uint local_4c;
  string_view local_48;
  
  iVar1 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xbf])();
  if (iVar1 == 0) {
    RVar2 = ReadU32Leb128(this,&local_4c,"sym count");
    if (RVar2.enum_ != Error) {
      iVar1 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xc0])(this->delegate_,(ulong)local_4c);
      if (iVar1 == 0) {
        bVar3 = local_4c != 0;
        local_4c = local_4c - 1;
        if (bVar3) {
          do {
            local_48._M_len = 0;
            local_48._M_str = (char *)0x0;
            RVar2 = ReadU8(this,&local_4d,"prefix");
            if (RVar2.enum_ == Error) {
              return (Result)Error;
            }
            RVar2 = ReadStr(this,&local_48,"feature name");
            if (RVar2.enum_ == Error) {
              return (Result)Error;
            }
            iVar1 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xc1])
                              (this->delegate_,(ulong)local_4d,local_48._M_len,local_48._M_str);
            if (iVar1 != 0) {
              format = "OnFeature callback failed";
              goto LAB_001476a6;
            }
            bVar3 = local_4c != 0;
            local_4c = local_4c - 1;
          } while (bVar3);
        }
        iVar1 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xc2])();
        if (iVar1 == 0) {
          return (Result)Ok;
        }
        format = "EndTargetFeaturesSection callback failed";
      }
      else {
        format = "OnFeatureCount callback failed";
      }
LAB_001476a6:
      PrintError(this,format);
    }
  }
  else {
    PrintError(this,"BeginTargetFeaturesSection callback failed");
  }
  return (Result)Error;
}

Assistant:

Result BinaryReader::ReadTargetFeaturesSections(Offset section_size) {
  CALLBACK(BeginTargetFeaturesSection, section_size);
  uint32_t count;
  CHECK_RESULT(ReadU32Leb128(&count, "sym count"));
  CALLBACK(OnFeatureCount, count);
  while (count--) {
    uint8_t prefix;
    std::string_view name;
    CHECK_RESULT(ReadU8(&prefix, "prefix"));
    CHECK_RESULT(ReadStr(&name, "feature name"));
    CALLBACK(OnFeature, prefix, name);
  }
  CALLBACK0(EndTargetFeaturesSection);
  return Result::Ok;
}